

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmInfo.cpp
# Opt level: O3

void __thiscall GmmLib::Context::DestroyContext(Context *this)

{
  if (this->pGmmCachePolicy != (GMM_CACHE_POLICY *)0x0) {
    (*this->pGmmCachePolicy->_vptr_GmmCachePolicyCommon[4])();
    this->pGmmCachePolicy = (GMM_CACHE_POLICY *)0x0;
  }
  if (this->pTextureCalc != (GMM_TEXTURE_CALC *)0x0) {
    (*this->pTextureCalc->_vptr_GmmTextureCalc[0xd])();
    this->pTextureCalc = (GMM_TEXTURE_CALC *)0x0;
  }
  if (this->pPlatformInfo != (PlatformInfo *)0x0) {
    (*this->pPlatformInfo->_vptr_PlatformInfo[1])();
    this->pPlatformInfo = (PlatformInfo *)0x0;
  }
  return;
}

Assistant:

void GMM_STDCALL GmmLib::Context::DestroyContext()
{
    if(this->pGmmCachePolicy)
    {
            delete this->pGmmCachePolicy;
            this->pGmmCachePolicy = NULL;
    }

    if(this->pTextureCalc)
    {
            delete this->pTextureCalc;
            this->pTextureCalc = NULL;
    }

    if(this->pPlatformInfo)
    {
            delete this->pPlatformInfo;
            this->pPlatformInfo = NULL;
    }
}